

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roboclaw.cpp
# Opt level: O0

ssize_t __thiscall RoboClaw::read(RoboClaw *this,int __fd,void *__buf,size_t __nbytes)

{
  code *pcVar1;
  undefined1 auVar2 [16];
  int iVar3;
  rep rVar4;
  void *__buf_00;
  int __fd_00;
  undefined8 *puVar5;
  type elapsed;
  time_point end;
  time_point start;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffffc8;
  duration<long,_std::ratio<1L,_1000000000L>_> local_30;
  undefined8 local_28;
  undefined8 local_20;
  int local_14;
  RoboClaw *local_10;
  undefined1 local_1;
  
  puVar5 = (undefined8 *)(ulong)(uint)__fd;
  local_14 = __fd;
  local_10 = this;
  if (this->m_serial == 0) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  local_20 = std::chrono::_V2::steady_clock::now();
  do {
    __fd_00 = (int)puVar5;
    iVar3 = available(this);
    if (iVar3 != 0) {
      rVar4 = read(this,__fd_00,__buf_00,__nbytes);
      local_1 = (undefined1)rVar4;
      goto LAB_00104d41;
    }
    local_28 = std::chrono::_V2::steady_clock::now();
    puVar5 = &local_20;
    local_30.__r = (rep)std::chrono::operator-
                                  (in_stack_ffffffffffffffc8,
                                   (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                    *)this);
    rVar4 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_30);
    auVar2 = vcvtusi2sd_avx512f(ZEXT816(0x41cdcd6500000000),local_14);
  } while (((double)rVar4 * 1000.0) / 1000000000.0 < auVar2._0_8_);
  local_1 = 0xff;
LAB_00104d41:
  return CONCAT71((int7)((ulong)rVar4 >> 8),local_1);
}

Assistant:

uint8_t RoboClaw::read(uint32_t timeout)
{
    if( m_serial )
    {
        auto start = std::chrono::steady_clock::now();

        // Empty buffer?
        while( !available() )
        {
            auto end = std::chrono::steady_clock::now();
            auto elapsed = end-start;
            if( elapsed.count() * 1000.0 / std::chrono::steady_clock::period().den >= timeout )
            {
                return -1;
            }
        }
        return read();
    }
}